

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

Position * __thiscall
pfederc::Position::operator+(Position *__return_storage_ptr__,Position *this,Position *pos)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = this->line;
  if (pos->line < this->line) {
    uVar2 = pos->line;
  }
  uVar3 = this->startIndex;
  if (pos->startIndex < this->startIndex) {
    uVar3 = pos->startIndex;
  }
  uVar1 = pos->endIndex;
  if (pos->endIndex < this->endIndex) {
    uVar1 = this->endIndex;
  }
  __return_storage_ptr__->line = uVar2;
  __return_storage_ptr__->startIndex = uVar3;
  __return_storage_ptr__->endIndex = uVar1;
  return __return_storage_ptr__;
}

Assistant:

Position Position::operator +(const Position &pos) const noexcept {
  return Position{std::min(line, pos.line),
    std::min(startIndex, pos.startIndex),
    std::max(endIndex, pos.endIndex)};
}